

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerHLSL::emit_texture_size_variants
          (CompilerHLSL *this,uint64_t variant_mask,char *vecsize_qualifier,bool uav,
          char *type_qualifier)

{
  uint32_t uVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  uint32_t index;
  long lVar6;
  char *pcVar7;
  char **ts_8;
  char *local_58;
  char *local_50;
  char *local_48;
  char *type_qualifier_local;
  char *vecsize_qualifier_local;
  
  if (variant_mask != 0) {
    pcVar4 = "Texture";
    if (uav) {
      pcVar4 = "Image";
    }
    pcVar2 = "RW";
    if (!uav) {
      pcVar2 = "";
    }
    pcVar3 = "uint Level, ";
    if (uav) {
      pcVar3 = "";
    }
    lVar6 = 0;
    type_qualifier_local = type_qualifier;
    vecsize_qualifier_local = vecsize_qualifier;
    do {
      lVar5 = 0;
      ts_8 = emit_texture_size_variants::types;
      do {
        if ((variant_mask >> ((ulong)(uint)((int)lVar5 + (int)lVar6) & 0x3f) & 1) != 0) {
          local_58 = pcVar3;
          local_50 = pcVar2;
          local_48 = pcVar4;
          CompilerGLSL::
          statement<char_const*&,char_const(&)[5],char_const*,char_const(&)[6],char_const*,char_const*&,char_const(&)[2],char_const*&,char_const*&,char_const*&,char_const(&)[8],char_const*,char_const(&)[16]>
                    (&this->super_CompilerGLSL,emit_texture_size_variants::ret_types + lVar6,
                     (char (*) [5])" spv",&local_48,(char (*) [6])0x36b55c,&local_50,
                     emit_texture_size_variants::dims + lVar6,(char (*) [2])0x3626d6,
                     &type_qualifier_local,ts_8,&vecsize_qualifier_local,(char (*) [8])"> Tex, ",
                     &local_58,(char (*) [16])"out uint Param)");
          CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
          CompilerGLSL::statement<char_const*&,char_const(&)[6]>
                    (&this->super_CompilerGLSL,emit_texture_size_variants::ret_types + lVar6,
                     (char (*) [6])0x36a172);
          uVar1 = emit_texture_size_variants::return_arguments[lVar6];
          if (uVar1 == 3) {
            if (emit_texture_size_variants::has_lod[lVar6] == true && !uav) {
              CompilerGLSL::statement<char_const(&)[54]>
                        (&this->super_CompilerGLSL,
                         (char (*) [54])"Tex.GetDimensions(Level, ret.x, ret.y, ret.z, Param);");
            }
            else {
              if (uav) {
                CompilerGLSL::statement<char_const(&)[40]>
                          (&this->super_CompilerGLSL,
                           (char (*) [40])"Tex.GetDimensions(ret.x, ret.y, ret.z);");
                goto LAB_00265906;
              }
              pcVar7 = "Tex.GetDimensions(ret.x, ret.y, ret.z, Param);";
LAB_0026594c:
              CompilerGLSL::statement<char_const(&)[47]>
                        (&this->super_CompilerGLSL,(char (*) [47])pcVar7);
            }
          }
          else if (uVar1 == 2) {
            if (emit_texture_size_variants::has_lod[lVar6] == true && !uav) {
              pcVar7 = "Tex.GetDimensions(Level, ret.x, ret.y, Param);";
              goto LAB_0026594c;
            }
            if (!uav) {
              pcVar7 = "Tex.GetDimensions(ret.x, ret.y, Param);";
              goto LAB_0026593e;
            }
            CompilerGLSL::statement<char_const(&)[33]>
                      (&this->super_CompilerGLSL,(char (*) [33])"Tex.GetDimensions(ret.x, ret.y);");
LAB_00265906:
            CompilerGLSL::statement<char_const(&)[12]>
                      (&this->super_CompilerGLSL,(char (*) [12])"Param = 0u;");
          }
          else if (uVar1 == 1) {
            if (emit_texture_size_variants::has_lod[lVar6] != true || uav) {
              CompilerGLSL::statement<char_const(&)[26]>
                        (&this->super_CompilerGLSL,(char (*) [26])"Tex.GetDimensions(ret.x);");
              goto LAB_00265906;
            }
            pcVar7 = "Tex.GetDimensions(Level, ret.x, Param);";
LAB_0026593e:
            CompilerGLSL::statement<char_const(&)[40]>
                      (&this->super_CompilerGLSL,(char (*) [40])pcVar7);
          }
          CompilerGLSL::statement<char_const(&)[12]>
                    (&this->super_CompilerGLSL,(char (*) [12])"return ret;");
          CompilerGLSL::end_scope(&this->super_CompilerGLSL);
          CompilerGLSL::statement<char_const(&)[1]>
                    (&this->super_CompilerGLSL,(char (*) [1])0x35b140);
        }
        ts_8 = ts_8 + 1;
        lVar5 = lVar5 + 0x10;
      } while (lVar5 != 0x30);
      lVar6 = lVar6 + 1;
    } while (lVar6 != 10);
  }
  return;
}

Assistant:

void CompilerHLSL::emit_texture_size_variants(uint64_t variant_mask, const char *vecsize_qualifier, bool uav,
                                              const char *type_qualifier)
{
	if (variant_mask == 0)
		return;

	static const char *types[QueryTypeCount] = { "float", "int", "uint" };
	static const char *dims[QueryDimCount] = { "Texture1D",   "Texture1DArray",  "Texture2D",   "Texture2DArray",
		                                       "Texture3D",   "Buffer",          "TextureCube", "TextureCubeArray",
		                                       "Texture2DMS", "Texture2DMSArray" };

	static const bool has_lod[QueryDimCount] = { true, true, true, true, true, false, true, true, false, false };

	static const char *ret_types[QueryDimCount] = {
		"uint", "uint2", "uint2", "uint3", "uint3", "uint", "uint2", "uint3", "uint2", "uint3",
	};

	static const uint32_t return_arguments[QueryDimCount] = {
		1, 2, 2, 3, 3, 1, 2, 3, 2, 3,
	};

	for (uint32_t index = 0; index < QueryDimCount; index++)
	{
		for (uint32_t type_index = 0; type_index < QueryTypeCount; type_index++)
		{
			uint32_t bit = 16 * type_index + index;
			uint64_t mask = 1ull << bit;

			if ((variant_mask & mask) == 0)
				continue;

			statement(ret_types[index], " spv", (uav ? "Image" : "Texture"), "Size(", (uav ? "RW" : ""),
			          dims[index], "<", type_qualifier, types[type_index], vecsize_qualifier, "> Tex, ",
			          (uav ? "" : "uint Level, "), "out uint Param)");
			begin_scope();
			statement(ret_types[index], " ret;");
			switch (return_arguments[index])
			{
			case 1:
				if (has_lod[index] && !uav)
					statement("Tex.GetDimensions(Level, ret.x, Param);");
				else
				{
					statement("Tex.GetDimensions(ret.x);");
					statement("Param = 0u;");
				}
				break;
			case 2:
				if (has_lod[index] && !uav)
					statement("Tex.GetDimensions(Level, ret.x, ret.y, Param);");
				else if (!uav)
					statement("Tex.GetDimensions(ret.x, ret.y, Param);");
				else
				{
					statement("Tex.GetDimensions(ret.x, ret.y);");
					statement("Param = 0u;");
				}
				break;
			case 3:
				if (has_lod[index] && !uav)
					statement("Tex.GetDimensions(Level, ret.x, ret.y, ret.z, Param);");
				else if (!uav)
					statement("Tex.GetDimensions(ret.x, ret.y, ret.z, Param);");
				else
				{
					statement("Tex.GetDimensions(ret.x, ret.y, ret.z);");
					statement("Param = 0u;");
				}
				break;
			}

			statement("return ret;");
			end_scope();
			statement("");
		}
	}
}